

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O2

int __thiscall
Rainbow::CommPort::CheckRespondCode
          (CommPort *this,string *respondMessage,string *futureCode,string *errorDesc)

{
  __type _Var1;
  int iVar2;
  const_iterator cVar3;
  int iVar4;
  string respondCode;
  
  std::__cxx11::string::substr((ulong)&respondCode,(ulong)respondMessage);
  _Var1 = std::operator==(&respondCode,futureCode);
  iVar4 = 0;
  if (!_Var1) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)_errDescTable_abi_cxx11_,&respondCode);
    if (cVar3._M_node == (_Base_ptr)(_errDescTable_abi_cxx11_ + 8)) {
      std::__cxx11::string::assign((char *)errorDesc);
      iVar4 = -1;
    }
    else {
      std::__cxx11::string::_M_assign((string *)this);
      std::__cxx11::string::_M_assign((string *)errorDesc);
      iVar2 = std::__cxx11::stoi(&respondCode,(size_t *)0x0,10);
      iVar4 = -iVar2;
      if (iVar2 < 1) {
        iVar4 = iVar2;
      }
    }
  }
  std::__cxx11::string::~string((string *)&respondCode);
  return iVar4;
}

Assistant:

int CommPort::CheckRespondCode(const std::string &respondMessage, 
					const std::string &futureCode,
					std::string &errorDesc)
	{
		std::string respondCode = respondMessage.substr(0, 3);
		
		if(respondCode == futureCode)
		{
			//errorDesc = "";
			return 0;
		}

		auto search = _errDescTable.find(respondCode);
		if(search != _errDescTable.end())
		{
			_errorMessage = search->second;
			errorDesc = search->second;
			return -(std::abs(std::stoi(respondCode)));
		}

		errorDesc = "Unknow error";
		return -1;
	}